

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O3

size_t __thiscall clickhouse::BufferedOutput::DoNext(BufferedOutput *this,void **data,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  
  if ((ulong)((long)(this->array_output_).end_ - (long)(this->array_output_).buf_) < len) {
    (*(this->super_ZeroCopyOutput).super_OutputStream._vptr_OutputStream[2])(this);
  }
  iVar1 = (*(this->array_output_).super_ZeroCopyOutput.super_OutputStream._vptr_OutputStream[4])
                    (&this->array_output_,data,len);
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

size_t BufferedOutput::DoNext(void** data, size_t len) {
    if (array_output_.Avail() < len) {
        Flush();
    }

    return array_output_.Next(data, len);

}